

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_WAKE(effect_handler_context_t_conflict *context)

{
  ushort uVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc grid1;
  monster_conflict *mon;
  source origin;
  
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  grid1 = origin_get_loc(origin);
  wVar3 = cave_monster_max(cave);
  if (L'\x01' < wVar3) {
    wVar3 = L'\x01';
    bVar2 = false;
    do {
      mon = (monster_conflict *)cave_monster(cave,wVar3);
      if (mon->race != (monster_race *)0x0) {
        uVar1 = z_info->max_sight;
        wVar4 = distance((loc_conflict)grid1,(loc_conflict)mon->grid);
        if ((SBORROW4(wVar4,(uint)uVar1 * 2) != wVar4 + (uint)uVar1 * -2 < 0) &&
           (mon->m_timed[0] != 0)) {
          monster_wake(mon,false,wVar4 * -2 + L'd');
          bVar2 = true;
        }
      }
      wVar3 = wVar3 + L'\x01';
      wVar4 = cave_monster_max(cave);
    } while (wVar3 < wVar4);
    if (bVar2) {
      msg("You hear a sudden stirring in the distance!");
    }
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_WAKE(effect_handler_context_t *context)
{
	int i;
	bool woken = false;

	struct loc origin = origin_get_loc(context->origin);

	/* Wake everyone nearby */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		if (mon->race) {
			int radius = z_info->max_sight * 2;
			int dist = distance(origin, mon->grid);

			/* Skip monsters too far away */
			if ((dist < radius) && mon->m_timed[MON_TMD_SLEEP]) {
				/* Monster wakes, closer means likelier to become aware */
				monster_wake(mon, false, 100 - 2 * dist);
				woken = true;
			}
		}
	}

	/* Messages */
	if (woken) {
		msg("You hear a sudden stirring in the distance!");
	}

	context->ident = true;

	return true;
}